

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

QSize __thiscall QToolBarLayout::expandedSize(QToolBarLayout *this,QSize *size)

{
  QLayoutStruct *pQVar1;
  double dVar2;
  bool bVar3;
  Orientation OVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QWidget *this_00;
  long lVar8;
  QStyle *pQVar9;
  long lVar10;
  QSize *pQVar11;
  undefined8 uVar12;
  int iVar13;
  Representation RVar14;
  int iVar15;
  bool *pbVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  QSize QVar29;
  long in_FS_OFFSET;
  QMargins QVar30;
  QStyleOptionToolBar opt;
  Representation local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  QVar29.wd.m_i = 0;
  QVar29.ht.m_i = 0;
  if (this_00 == (QWidget *)0x0) goto LAB_004b543a;
  lVar8 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  OVar4 = QToolBar::orientation((QToolBar *)this_00);
  pQVar9 = QWidget::style(this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOptionToolBar *)local_98);
  bVar3 = movable(this);
  if (bVar3) {
    uVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x35,local_98,this_00);
    QVar29.ht.m_i = 0;
    QVar29.wd.m_i = uVar5;
  }
  QVar30 = QLayout::contentsMargins(&this->super_QLayout);
  iVar6 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
  iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x39,local_98);
  lVar10 = (this->items).d.size;
  if (lVar10 == 0) {
LAB_004b51ac:
    uVar26 = 0;
    uVar5 = 0;
  }
  else {
    pbVar16 = &((this->geomArray).d.ptr)->empty;
    iVar13 = 0;
    iVar22 = 0;
    do {
      if (*pbVar16 == false) {
        iVar15 = iVar6;
        if (iVar13 == 0) {
          iVar15 = 0;
        }
        iVar22 = iVar15 + iVar22 + *(int *)(pbVar16 + -9);
        iVar13 = iVar13 + 1;
      }
      pbVar16 = pbVar16 + 0x20;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    if (iVar13 == 0) goto LAB_004b51ac;
    pQVar11 = (QSize *)&size->ht;
    if (OVar4 == Horizontal) {
      pQVar11 = size;
    }
    dVar2 = (double)iVar13;
    uVar5 = (pQVar11->wd).m_i;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    iVar13 = 2;
    if ((int)dVar2 != 1) {
      iVar13 = (int)dVar2;
    }
    iVar7 = iVar7 + iVar6;
    iVar13 = iVar22 / iVar13 + iVar7;
    local_b8 = QVar30.m_left.m_i;
    RVar14.m_i = QVar30.m_top.m_i.m_i;
    if (OVar4 == Horizontal) {
      RVar14.m_i = local_b8.m_i;
    }
    uVar26 = QVar30._8_8_ >> 0x20;
    if (OVar4 == Horizontal) {
      uVar26 = QVar30._8_8_;
    }
    iVar15 = RVar14.m_i + QVar29.wd.m_i.m_i + (int)uVar26;
    iVar22 = uVar5 - iVar15;
    if (iVar22 < iVar13) {
      iVar22 = iVar13;
    }
    if (lVar8 != 0) {
      lVar10 = *(long *)(lVar8 + 0x20);
      iVar13 = *(int *)(lVar10 + 0x20) - *(int *)(lVar10 + 0x18);
      if (OVar4 == Horizontal) {
        iVar13 = *(int *)(lVar10 + 0x1c) - *(int *)(lVar10 + 0x14);
      }
      iVar13 = (iVar13 - iVar15) + 1;
      if (iVar13 <= iVar22) {
        iVar22 = iVar13;
      }
    }
    lVar10 = (this->items).d.size;
    if (lVar10 == 0) {
      iVar13 = 0;
      iVar15 = 0;
    }
    else {
      iVar20 = 0;
      iVar15 = 0;
      iVar13 = 0;
      do {
        lVar25 = (long)iVar20;
        iVar23 = 0;
        iVar28 = 0;
        if (lVar25 < lVar10) {
          lVar27 = lVar25 * 8;
          iVar24 = 0;
          iVar21 = -1;
          iVar28 = 0;
          iVar23 = 0;
          do {
            pQVar1 = (this->geomArray).d.ptr;
            if ((&pQVar1->empty)[lVar27 * 4] == false) {
              iVar20 = iVar6;
              if (iVar24 == 0) {
                iVar20 = 0;
              }
              iVar17 = iVar20 + iVar23 + (&pQVar1->minimumSize)[lVar27];
              uVar12 = (**(code **)(**(long **)((long)(this->items).d.ptr + lVar27) + 0x10))();
              iVar20 = (int)((ulong)uVar12 >> 0x20);
              if (OVar4 == Vertical) {
                iVar20 = (int)uVar12;
              }
              if (iVar28 <= iVar20) {
                iVar28 = iVar20;
              }
              iVar20 = (int)lVar25;
              if ((iVar21 != -1) && (iVar22 < iVar17)) {
                if ((1 < iVar24) && (iVar22 < iVar7 + iVar23)) {
                  iVar23 = iVar23 - ((this->geomArray).d.ptr[iVar21].minimumSize + iVar6);
                  iVar20 = iVar21;
                }
                goto LAB_004b5382;
              }
              iVar24 = iVar24 + 1;
              lVar10 = (this->items).d.size;
              iVar21 = iVar20;
              iVar23 = iVar17;
            }
            lVar25 = lVar25 + 1;
            lVar27 = lVar27 + 8;
          } while (lVar25 < lVar10);
          iVar20 = (int)lVar25;
        }
LAB_004b5382:
        if (iVar13 < iVar23) {
          iVar13 = iVar23;
        }
        iVar15 = iVar15 + iVar6 + iVar28;
        lVar10 = (this->items).d.size;
      } while (iVar20 < lVar10);
    }
    uVar18 = iVar7 + QVar29.wd.m_i.m_i + local_b8.m_i + QVar30.m_right.m_i.m_i + iVar13;
    if ((int)uVar18 <= (int)uVar5) {
      uVar18 = uVar5;
    }
    uVar5 = uVar18;
    if (lVar8 != 0) {
      lVar8 = *(long *)(lVar8 + 0x20);
      iVar7 = *(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18);
      if (OVar4 == Horizontal) {
        iVar7 = *(int *)(lVar8 + 0x1c) - *(int *)(lVar8 + 0x14);
      }
      uVar5 = iVar7 + 1U;
      if ((int)uVar18 < (int)(iVar7 + 1U)) {
        uVar5 = uVar18;
      }
    }
    uVar18 = ((QVar30.m_bottom.m_i.m_i + QVar30.m_top.m_i.m_i) - iVar6) + iVar15;
    uVar26 = (ulong)uVar18;
    if (OVar4 != Horizontal) {
      uVar19 = uVar5;
      if (OVar4 != Vertical) {
        uVar19 = uVar18;
      }
      uVar5 = 0xffffffff;
      if (OVar4 == Vertical) {
        uVar5 = uVar18;
      }
      uVar26 = (ulong)uVar19;
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
  QVar29 = (QSize)((ulong)uVar5 | uVar26 << 0x20);
LAB_004b543a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar29;
}

Assistant:

QSize QToolBarLayout::expandedSize(const QSize &size) const
{
    if (dirty)
        updateGeomArray();

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return QSize(0, 0);
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    Qt::Orientation o = tb->orientation();
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);

    int total_w = 0;
    int count = 0;
    for (int x = 0; x < items.size(); ++x) {
        if (!geomArray[x].empty) {
            total_w += (count == 0 ? 0 : spacing) + geomArray[x].minimumSize;
            ++count;
        }
    }
    if (count == 0)
        return QSize(0, 0);

    int min_w = pick(o, size);
    int rows = (int)qSqrt(qreal(count));
    if (rows == 1)
        ++rows;      // we want to expand to at least two rows
    int space = total_w/rows + spacing + extensionExtent;
    space = qMax(space, min_w - pick(o, margins) - handleExtent);
    if (win != nullptr)
        space = qMin(space, pick(o, win->size()) - pick(o, margins) - handleExtent);

    int w = 0;
    int h = 0;
    int i = 0;
    while (i < items.size()) {
        int count = 0;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        for (; i < items.size(); ++i) {
            if (geomArray[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + geomArray[i].minimumSize;
            rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            if (prev != -1 && newSize > space) {
                if (count > 1 && size + spacing + extensionExtent > space) {
                    size -= spacing + geomArray[prev].minimumSize;
                    i = prev;
                }
                break;
            }

            size = newSize;
            prev = i;
            ++count;
        }

        w = qMax(size, w);
        h += rowHeight + spacing;
    }

    w += pick(Qt::Horizontal, margins) + handleExtent + spacing + extensionExtent;
    w = qMax(w, min_w);
    if (win != nullptr)
        w = qMin(w, pick(o, win->size()));
    h += pick(Qt::Vertical, margins) - spacing; //there is no spacing before the first row

    QSize result;
    rpick(o, result) = w;
    rperp(o, result) = h;
    return result;
}